

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O0

DebugStream * __thiscall DebugStream::timestamp_abi_cxx11_(DebugStream *this,uint64_t t)

{
  __cxx11 local_88 [32];
  __cxx11 local_68 [55];
  undefined1 local_31;
  ulong local_30;
  uint64_t s;
  uint64_t ms;
  uint64_t us;
  uint64_t t_local;
  string *_s;
  
  ms = t % 1000;
  local_30 = (t / 1000) / 1000;
  s = (t / 1000) % 1000;
  local_31 = 0;
  us = t;
  t_local = (uint64_t)this;
  std::__cxx11::to_string((__cxx11 *)this,local_30);
  std::__cxx11::string::operator+=((string *)this,"s:");
  std::__cxx11::to_string(local_68,s);
  std::__cxx11::string::operator+=((string *)this,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::operator+=((string *)this,"ms:");
  std::__cxx11::to_string(local_88,ms);
  std::__cxx11::string::operator+=((string *)this,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::operator+=((string *)this,"us");
  return this;
}

Assistant:

static std::string timestamp(const uint64_t t)
    {
        uint64_t us = t % 1000;
        uint64_t ms = t / 1000;
        uint64_t s = ms / 1000;
        ms = ms % 1000;
        std::string _s = std::to_string(s);
        _s += "s:";
        _s += std::to_string(ms);
        _s += "ms:";
        _s += std::to_string(us);
        _s += "us";
        return _s;
    }